

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

int __thiscall
HEVCStreamReader::writeAdditionData
          (HEVCStreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  bool needInsSpsPps;
  NalType nalType;
  int offset;
  uint8_t *curPos;
  PriorityDataInfo *priorityData_local;
  AVPacket *avPacket_local;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  HEVCStreamReader *this_local;
  
  _nalType = dstBuffer;
  if ((4 < avPacket->size) && ((long)avPacket->size < (long)dstEnd - (long)dstBuffer)) {
    iVar1 = 4;
    if (avPacket->data[2] == '\x01') {
      iVar1 = 3;
    }
    if (((int)(uint)avPacket->data[iVar1] >> 1 & 0x3fU) == 0x23) {
      memcpy(dstBuffer,avPacket->data,(long)avPacket->size);
      _nalType = dstBuffer + avPacket->size;
      avPacket->size = 0;
      avPacket->data = (uint8_t *)0x0;
    }
  }
  bVar3 = false;
  if ((this->m_firstFileFrame & 1U) != 0) {
    bVar3 = (avPacket->flags & 0x20) == 0;
  }
  if (bVar3) {
    avPacket->flags = avPacket->flags | 0x20;
    puVar2 = writeBuffer(this,&this->m_vpsBuffer,_nalType,dstEnd);
    puVar2 = writeBuffer(this,&this->m_spsBuffer,puVar2,dstEnd);
    _nalType = writeBuffer(this,&this->m_ppsBuffer,puVar2,dstEnd);
  }
  this->m_firstFileFrame = false;
  return (int)_nalType - (int)dstBuffer;
}

Assistant:

int HEVCStreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                        PriorityDataInfo* priorityData)
{
    uint8_t* curPos = dstBuffer;

    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        const int offset = avPacket.data[2] == 1 ? 3 : 4;
        const auto nalType = static_cast<HevcUnit::NalType>((avPacket.data[offset] >> 1) & 0x3f);
        if (nalType == HevcUnit::NalType::AUD)
        {
            // place delimiter at first place
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    const bool needInsSpsPps = m_firstFileFrame && !(avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP);
    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        curPos = writeBuffer(m_vpsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_spsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_ppsBuffer, curPos, dstEnd);
    }

    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}